

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O0

void __thiscall
PersistentStorageJsonTestSuite_GetDomainFromEmpty_Test::TestBody
          (PersistentStorageJsonTestSuite_GetDomainFromEmpty_Test *this)

{
  Status SVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_188;
  AssertHelper local_168;
  Message local_160;
  bool local_151;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_120;
  Message local_118;
  DomainId local_110;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__1;
  Domain returnValue;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  PersistentStorageJson psj;
  PersistentStorageJsonTestSuite_GetDomainFromEmpty_Test *this_local;
  
  psj.mStorageLock.mPlatform = (sem_t *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"./tmp/test.tmp",&local_71);
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            ((PersistentStorageJson *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Open
                    ((PersistentStorageJson *)local_50);
  local_99 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&returnValue.mName.field_2 + 8),(internal *)local_98,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x101,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)(returnValue.mName.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  ot::commissioner::persistent_storage::Domain::Domain((Domain *)&gtest_ar__1.message_);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_110,0);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    ((PersistentStorageJson *)local_50,(RegistrarId *)&local_110,
                     (Domain *)&gtest_ar__1.message_);
  local_109 = SVar1 == kNotFound;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_108,
               (AssertionResult *)
               "psj.Get(DomainId(0), returnValue) == PersistentStorage::Status::kNotFound","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x105,pcVar3);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Close
                    ((PersistentStorageJson *)local_50);
  local_151 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_150,&local_151,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar2) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_188,(internal *)local_150,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x107,pcVar3);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  ot::commissioner::persistent_storage::Domain::~Domain((Domain *)&gtest_ar__1.message_);
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson
            ((PersistentStorageJson *)local_50);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetDomainFromEmpty)
{
    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    Domain returnValue;

    EXPECT_TRUE(psj.Get(DomainId(0), returnValue) == PersistentStorage::Status::kNotFound);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}